

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O2

int history_def_init(void **p,HistEvent *ev,int n)

{
  int iVar1;
  undefined4 *puVar2;
  
  puVar2 = (undefined4 *)malloc(0x40);
  if (puVar2 == (undefined4 *)0x0) {
    iVar1 = -1;
  }
  else {
    *(undefined4 **)(puVar2 + 8) = puVar2;
    *(undefined4 **)(puVar2 + 6) = puVar2;
    *(undefined8 *)(puVar2 + 2) = 0;
    *puVar2 = 0;
    *(undefined4 **)(puVar2 + 10) = puVar2;
    *(undefined8 *)(puVar2 + 0xc) = 0;
    *(undefined8 *)(puVar2 + 0xe) = 0;
    *p = puVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
history_def_init(void **p, TYPE(HistEvent) *ev __attribute__((__unused__)), int n)
{
	history_t *h = (history_t *) h_malloc(sizeof(*h));
	if (h == NULL)
		return -1;

	if (n <= 0)
		n = 0;
	h->eventid = 0;
	h->cur = 0;
	h->max = n;
	h->list.next = h->list.prev = &h->list;
	h->list.ev.str = NULL;
	h->list.ev.num = 0;
	h->cursor = &h->list;
	h->flags = 0;
	*p = h;
	return 0;
}